

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

pseudo_t linearize_inc_dec(dmr_C *C,entrypoint *ep,expression *expr,int postop)

{
  int iVar1;
  int iVar2;
  pseudo_t left;
  pseudo_t ppVar3;
  undefined1 auStack_68 [8];
  access_data ad;
  
  ad.offset = 0;
  ad.pos._0_4_ = 0;
  ad.source_type = (symbol *)0x0;
  ad.address = (pseudo_t)0x0;
  auStack_68 = (undefined1  [8])0x0;
  ad.result_type = (symbol *)0x0;
  iVar1 = expr->op;
  iVar2 = linearize_address_gen(C,ep,(expr->field_5).field_3.unop,(access_data *)auStack_68);
  if (iVar2 == 0) {
    left = &C->L->void_pseudo;
  }
  else {
    left = linearize_load_gen(C,ep,(access_data *)auStack_68);
    ppVar3 = dmrC_value_pseudo(C,expr->ctype,(expr->field_5).field_3.op_value);
    ppVar3 = add_binary_op(C,ep,expr->ctype,(iVar1 != 0x101) + 9,left,ppVar3);
    linearize_store_gen(C,ep,ppVar3,(access_data *)auStack_68);
    if (postop == 0) {
      left = ppVar3;
    }
  }
  return left;
}

Assistant:

static pseudo_t linearize_inc_dec(struct dmr_C *C, struct entrypoint *ep, struct expression *expr, int postop)
{
	struct access_data ad;
	pseudo_t old, new, one;
        
        memset(&ad, 0, sizeof ad);
	int op = expr->op == SPECIAL_INCREMENT ? OP_ADD : OP_SUB;

	if (!linearize_address_gen(C, ep, expr->unop, &ad))
		return VOID_PSEUDO(C);

	old = linearize_load_gen(C, ep, &ad);
	one = dmrC_value_pseudo(C, expr->ctype, expr->op_value);
	new = add_binary_op(C, ep, expr->ctype, op, old, one);
	linearize_store_gen(C, ep, new, &ad);
	finish_address_gen(ep, &ad);
	return postop ? old : new;
}